

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Expression> __thiscall Parser::postfix(Parser *this,ptr<Expression> *callee)

{
  size_type sVar1;
  bool bVar2;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ptr<Expression> pVar4;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  bVar2 = match((Parser *)callee,LeftParen);
  if (bVar2) {
    local_28 = *in_RDX;
    local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
    pVar4 = call(this,callee);
    _Var3 = pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    this_00 = local_20;
  }
  else {
    bVar2 = match((Parser *)callee,LeftBrack);
    if (bVar2) {
      local_38 = *in_RDX;
      local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_30->_M_use_count = local_30->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_30->_M_use_count = local_30->_M_use_count + 1;
        }
      }
      access(this,(char *)callee,(int)&local_38);
      _Var3._M_pi = extraout_RDX_00;
      this_00 = local_30;
    }
    else {
      bVar2 = match((Parser *)callee,Dot);
      if (!bVar2) {
        (this->filepath)._M_dataplus._M_p = (pointer)*in_RDX;
        (this->filepath)._M_string_length = 0;
        sVar1 = in_RDX[1];
        in_RDX[1] = 0;
        (this->filepath)._M_string_length = sVar1;
        *in_RDX = 0;
        _Var3._M_pi = extraout_RDX;
        goto LAB_0011021f;
      }
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      pVar4 = memberAccess(this,callee);
      _Var3 = pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_01;
  }
LAB_0011021f:
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::postfix(ptr<Expression> callee) {
    if(match(TokenType::LeftParen)) {
        return call(callee);
    } else if(match(TokenType::LeftBrack)) {
        return access(callee);
    } else if(match(TokenType::Dot)) {
        return memberAccess(callee);
    }
    return callee;
}